

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hsluv.c
# Opt level: O0

void test_rgb2hsluv(void)

{
  int iVar1;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double l;
  double s;
  double h;
  double in_stack_00000030;
  int i;
  double local_38;
  double local_30;
  double local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x1000; local_4 = local_4 + 1) {
    acutest_case_("%s",snapshot + local_4);
    rgb2hsluv(in_stack_00000030,h,s,(double *)l,in_stack_00000010,in_stack_00000008);
    if ((double)local_10 - snapshot[local_4].hsluv_h < 0.0) {
      local_28 = -((double)local_10 - snapshot[local_4].hsluv_h);
    }
    else {
      local_28 = (double)local_10 - snapshot[local_4].hsluv_h;
    }
    iVar1 = acutest_check_((int)(ulong)(local_28 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x34,"%s channel","hue");
    if (iVar1 == 0) {
      acutest_message_(local_10,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].hsluv_h,"Expected: %f");
    }
    if ((double)local_18 - snapshot[local_4].hsluv_s < 0.0) {
      local_30 = -((double)local_18 - snapshot[local_4].hsluv_s);
    }
    else {
      local_30 = (double)local_18 - snapshot[local_4].hsluv_s;
    }
    iVar1 = acutest_check_((int)(ulong)(local_30 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x35,"%s channel","saturation");
    if (iVar1 == 0) {
      acutest_message_(local_18,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].hsluv_s,"Expected: %f");
    }
    if ((double)local_20 - snapshot[local_4].hsluv_l < 0.0) {
      local_38 = -((double)local_20 - snapshot[local_4].hsluv_l);
    }
    else {
      local_38 = (double)local_20 - snapshot[local_4].hsluv_l;
    }
    iVar1 = acutest_check_((int)(ulong)(local_38 < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x36,"%s channel","lightness");
    if (iVar1 == 0) {
      acutest_message_(local_20,"Produced: %f");
      acutest_message_((char *)snapshot[local_4].hsluv_l,"Expected: %f");
    }
  }
  return;
}

Assistant:

static void
test_rgb2hsluv(void)
{
    int i;

    for(i = 0; i < snapshot_n; i++) {
        double h, s, l;

        TEST_CASE(snapshot[i].hex_str);

        rgb2hsluv(snapshot[i].rgb_r, snapshot[i].rgb_g, snapshot[i].rgb_b, &h, &s, &l);

        TEST_CHANNEL("hue", h, snapshot[i].hsluv_h);
        TEST_CHANNEL("saturation", s, snapshot[i].hsluv_s);
        TEST_CHANNEL("lightness", l, snapshot[i].hsluv_l);
    }
}